

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

reference __thiscall
absl::
InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
::emplace_back<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>
          (InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
           *this,QueueEntry *args)

{
  ulong uVar1;
  uint64 uVar2;
  reference pQVar3;
  ulong uVar4;
  Rep *pRVar5;
  ulong uVar6;
  
  uVar1 = (this->allocator_and_tag_).tag_.size_;
  uVar4 = uVar1 >> 1;
  uVar6 = 0x10;
  if ((uVar1 & 1) != 0) {
    uVar6 = *(ulong *)&this->rep_;
  }
  pRVar5 = &this->rep_;
  if (uVar6 < uVar4) {
    __assert_fail("s <= capacity()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                  ,0x217,
                  "reference absl::InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry, 16>::emplace_back(Args &&...) [T = S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry, N = 16, A = std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>, Args = <S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>]"
                 );
  }
  if (uVar4 == uVar6) {
    pQVar3 = GrowAndEmplaceBack<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>(this,args);
    return pQVar3;
  }
  if (uVar4 < uVar6) {
    if ((uVar1 & 1) != 0) {
      pRVar5 = *(Rep **)((long)&this->rep_ + 8);
    }
    (this->allocator_and_tag_).tag_.size_ = uVar1 + 2;
    pQVar3 = (reference)((long)pRVar5 + uVar4 * 0x18);
    pQVar3->index_cell = args->index_cell;
    uVar2 = (args->id).id_;
    (pQVar3->distance).super_S1ChordAngle.length2_ = (args->distance).super_S1ChordAngle.length2_;
    (pQVar3->id).id_ = uVar2;
    return pQVar3;
  }
  __assert_fail("s < capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x21b,
                "reference absl::InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry, 16>::emplace_back(Args &&...) [T = S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry, N = 16, A = std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>, Args = <S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>]"
               );
}

Assistant:

reference emplace_back(Args&&... args) {
    size_type s = size();
    assert(s <= capacity());
    if (ABSL_PREDICT_FALSE(s == capacity())) {
      return GrowAndEmplaceBack(std::forward<Args>(args)...);
    }
    assert(s < capacity());

    pointer space;
    if (allocated()) {
      tag().set_allocated_size(s + 1);
      space = allocated_space();
    } else {
      tag().set_inline_size(s + 1);
      space = inlined_space();
    }
    return Construct(space + s, std::forward<Args>(args)...);
  }